

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balk.cpp
# Opt level: O0

void __thiscall Balk::Balk(Balk *this,int balk_size,double segment_length,double E,double J)

{
  shared_ptr<InitForce> local_d0;
  shared_ptr<Term> local_c0;
  shared_ptr<InitMoment> local_b0;
  shared_ptr<Term> local_a0;
  double local_90;
  shared_ptr<InitAngle> local_88;
  shared_ptr<Term> local_78 [2];
  double local_58;
  shared_ptr<InitShift> local_50;
  shared_ptr<Term> local_40;
  double local_30;
  double J_local;
  double E_local;
  double segment_length_local;
  Balk *pBStack_10;
  int balk_size_local;
  Balk *this_local;
  
  this->balk_size = balk_size;
  this->segment_length = segment_length;
  this->E = E;
  this->J = J;
  local_30 = J;
  J_local = E;
  E_local = segment_length;
  segment_length_local._4_4_ = balk_size;
  pBStack_10 = this;
  std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::vector(&this->terms);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->A);
  std::vector<double,_std::allocator<double>_>::vector(&this->x);
  std::vector<double,_std::allocator<double>_>::vector(&this->b);
  local_58 = J_local * local_30;
  std::make_shared<InitShift,double>((double *)&local_50);
  std::shared_ptr<Term>::shared_ptr<InitShift,void>(&local_40,&local_50);
  std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::push_back
            (&this->terms,&local_40);
  std::shared_ptr<Term>::~shared_ptr(&local_40);
  std::shared_ptr<InitShift>::~shared_ptr(&local_50);
  local_90 = J_local * local_30;
  std::make_shared<InitAngle,double>((double *)&local_88);
  std::shared_ptr<Term>::shared_ptr<InitAngle,void>(local_78,&local_88);
  std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::push_back
            (&this->terms,local_78);
  std::shared_ptr<Term>::~shared_ptr(local_78);
  std::shared_ptr<InitAngle>::~shared_ptr(&local_88);
  std::make_shared<InitMoment>();
  std::shared_ptr<Term>::shared_ptr<InitMoment,void>(&local_a0,&local_b0);
  std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::push_back
            (&this->terms,&local_a0);
  std::shared_ptr<Term>::~shared_ptr(&local_a0);
  std::shared_ptr<InitMoment>::~shared_ptr(&local_b0);
  std::make_shared<InitForce>();
  std::shared_ptr<Term>::shared_ptr<InitForce,void>(&local_c0,&local_d0);
  std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::push_back
            (&this->terms,&local_c0);
  std::shared_ptr<Term>::~shared_ptr(&local_c0);
  std::shared_ptr<InitForce>::~shared_ptr(&local_d0);
  return;
}

Assistant:

Balk::Balk(int balk_size, double segment_length, double E, double J)
    : balk_size(balk_size), segment_length(segment_length), E(E), J(J)
{
    terms.push_back(std::make_shared<InitShift>(E * J));
    terms.push_back(std::make_shared<InitAngle>(E * J));
    terms.push_back(std::make_shared<InitMoment>());
    terms.push_back(std::make_shared<InitForce>());
}